

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_create.c
# Opt level: O2

mpt_metatype * mpt_iterator_create(char *conf)

{
  char cVar1;
  ushort uVar2;
  long lVar3;
  int iVar4;
  ushort **ppuVar5;
  int *piVar6;
  mpt_metatype *pmVar7;
  size_t __n;
  mpt_value local_50;
  undefined8 local_40;
  char buf [32];
  
  if (conf != (char *)0x0) {
    while (cVar1 = *conf, (long)cVar1 != 0) {
      ppuVar5 = __ctype_b_loc();
      uVar2 = (*ppuVar5)[cVar1];
      if ((uVar2 >> 0xd & 1) == 0) {
        __n = 0xffffffffffffffff;
        while ((uVar2 & 0x300) != 0) {
          lVar3 = __n + 1;
          __n = __n + 1;
          uVar2 = (*ppuVar5)[conf[lVar3]];
        }
        if (__n + 1 < 0x20) {
          if (__n == 0xffffffffffffffff) {
            pmVar7 = mpt_iterator_values(conf);
            return pmVar7;
          }
          memcpy(buf,conf,__n);
          buf[__n] = '\0';
          local_40 = conf + __n;
          local_50._addr = &local_40;
          local_50._type = 0x73;
          iVar4 = strcasecmp(buf,"linear");
          if ((iVar4 == 0) || (iVar4 = strcasecmp(buf,"lin"), iVar4 == 0)) {
            pmVar7 = _mpt_iterator_linear(&local_50);
            return pmVar7;
          }
          iVar4 = strcasecmp(buf,"factor");
          if (((iVar4 == 0) || (iVar4 = strcasecmp(buf,"fact"), iVar4 == 0)) ||
             (iVar4 = strcasecmp(buf,"fac"), iVar4 == 0)) {
            pmVar7 = _mpt_iterator_factor(&local_50);
            return pmVar7;
          }
          iVar4 = strcasecmp(buf,"range");
          if (iVar4 == 0) {
            pmVar7 = _mpt_iterator_range(&local_50);
            return pmVar7;
          }
        }
        piVar6 = __errno_location();
        *piVar6 = 0x16;
        return (mpt_metatype *)0x0;
      }
      conf = conf + 1;
      local_40 = conf;
    }
  }
  pmVar7 = _mpt_iterator_range((mpt_value *)0x0);
  return pmVar7;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_create(const char *conf)
{
	MPT_STRUCT(value) val = MPT_VALUE_INIT(0, 0);
	size_t len;
	char buf[32];
	char curr;
	
	if (!conf) {
		return _mpt_iterator_range(0);
	}
	/* consume whitespace */
	while (*conf && isspace(*conf)) {
		conf++;
	}
	if (!(curr = *conf)) {
		return _mpt_iterator_range(0);
	}
	/* extract description string */
	len = 0;
	while ((isupper(curr) || islower(curr))) {
		curr = conf[len++];
	}
	if (len >= sizeof(buf)) {
		errno = EINVAL;
		return 0;
	}
	/* no description -> use normal values */
	if (!len--) {
		return mpt_iterator_values(conf);
	}
	
	memcpy(buf, conf, len);
	buf[len] = 0;
	
	conf += len;
	MPT_value_set(&val, 's', &conf);
	
	/* create matching iterators */
	if (!strcasecmp(buf, "linear")
	 || !strcasecmp(buf, "lin")) {
		return _mpt_iterator_linear(&val);
	}
	if (!strcasecmp(buf, "factor")
	 || !strcasecmp(buf, "fact")
	 || !strcasecmp(buf, "fac")) {
		return _mpt_iterator_factor(&val);
	}
	if (!strcasecmp(buf, "range")) {
		return _mpt_iterator_range(&val);
	}
	/* unknown value iterator type */
	errno = EINVAL;
	return 0;
}